

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaUtil.cpp
# Opt level: O2

void __thiscall MatrixProperties::computemuBI(MatrixProperties *this)

{
  size_type i;
  ulong uVar1;
  MatrixProperties *pMVar2;
  reference pdVar3;
  long lVar4;
  ostream *poVar5;
  ulong uVar6;
  int iVar7;
  size_type j;
  long lVar8;
  size_type i_00;
  double dVar9;
  double dVar10;
  undefined8 uVar11;
  allocator_type local_99;
  element_type *local_98;
  double local_90;
  MatrixProperties *local_88;
  size_type local_80;
  double local_78;
  undefined8 uStack_70;
  ulong local_68;
  long local_60;
  double local_58;
  undefined8 uStack_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_98 = (this->matrix).
             super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  uVar1 = local_98->size1_;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,uVar1 + 1,&local_99);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->BI,&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  this->muBI = 0.0;
  uVar6 = 0;
  iVar7 = (int)uVar1;
  local_68 = 0;
  if (0 < iVar7) {
    local_68 = uVar1 & 0xffffffff;
  }
  dVar9 = 0.0;
  local_80 = 1;
  local_88 = this;
  for (; pMVar2 = local_88, uVar6 != local_68; uVar6 = uVar6 + 1) {
    local_90 = 0.0;
    lVar4 = 1;
    while (lVar4 != 0xd) {
      i_00 = uVar6 - lVar4;
      i = lVar4 + uVar6;
      j = local_80;
      local_60 = lVar4;
      for (lVar8 = -1; lVar8 != -4; lVar8 = lVar8 + -1) {
        dVar9 = 0.0;
        uVar11 = 0;
        if (-1 < (long)i_00) {
          if (-1 < (long)(uVar6 + lVar8)) {
            pdVar3 = boost::numeric::ublas::
                     matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                     ::at_element(local_98,i_00,uVar6 + lVar8);
            dVar9 = *pdVar3;
          }
          uVar11 = 0;
          if ((int)j < iVar7) {
            uStack_70 = 0;
            local_78 = dVar9;
            pdVar3 = boost::numeric::ublas::
                     matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                     ::at_element(local_98,i_00,j);
            dVar9 = local_78 - *pdVar3;
            uVar11 = uStack_70;
          }
        }
        dVar10 = 0.0;
        if ((int)i < iVar7) {
          local_78 = dVar9;
          uStack_70 = uVar11;
          if (-1 < (long)(uVar6 + lVar8)) {
            pdVar3 = boost::numeric::ublas::
                     matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                     ::at_element(local_98,i,uVar6 + lVar8);
            dVar10 = *pdVar3;
          }
          dVar9 = local_78;
          if ((int)j < iVar7) {
            uStack_50 = 0;
            local_58 = dVar10;
            pdVar3 = boost::numeric::ublas::
                     matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                     ::at_element(local_98,i,j);
            dVar10 = local_58 - *pdVar3;
            dVar9 = local_78;
          }
        }
        local_90 = local_90 + ABS(dVar10) + ABS(dVar9);
        j = j + 1;
      }
      lVar4 = local_60 + 1;
    }
    (local_88->BI).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] = local_90;
    dVar9 = local_90 + local_88->muBI;
    local_88->muBI = dVar9;
    local_80 = local_80 + 1;
  }
  local_88->muBI = dVar9 / (double)iVar7;
  std::operator<<((ostream *)&std::cerr,"Mean Boundary Index is ");
  poVar5 = std::ostream::_M_insert<double>(pMVar2->muBI);
  std::endl<char,std::char_traits<char>>(poVar5);
  return;
}

Assistant:

void MatrixProperties::computemuBI() {
    using namespace boost::range;
    // A reference will be easier to work with here
    SparseMatrix& M = *matrix;
    int n = matrix->size1();
    BI = std::vector<double>(matrix->size1()+1);

    double interval = 3;
    double steps = 12;
    double b = 0, a1, a2;
    muBI = 0;
    for (int i=0; i<n; i++) {
        b = 0;
        for (int q=1; q<=steps; q++) {
            for (int p=1; p<=interval; p++){
                a1 = 0;
                a2 = 0;
                if (i-q >= 0) {
                    if (i-p >= 0)
                        a1 = M(i-q, i-p);
                    if (i+p < n)
                        a1 -= M(i-q, i+p);
                }
                if (i+q < n) {
                    if (i-p >= 0)
                        a2 = M(i+q, i-p);
                    if (i+p < n)
                        a2 -= M(i+q, i+p);
                }
                b += abs(a1) + abs(a2);
            }
        }
        BI[i] = b;
        muBI += b;
    }
    muBI /= n;
    cerr << "Mean Boundary Index is " << muBI << endl;
}